

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_dbcc(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  abi_ptr_conflict addr;
  TCGContext_conflict2 *s_00;
  TCGv_i32 arg;
  uint32_t uVar1;
  TCGLabel *l1;
  TCGTemp *pTVar2;
  TCGv_i32 ret;
  short local_34;
  
  s_00 = s->uc->tcg_ctx;
  arg = s_00->cpu_dregs[insn & 7];
  addr = s->pc;
  uVar1 = cpu_lduw_code_m68k(env,addr);
  s->pc = s->pc + 2;
  l1 = gen_new_label_m68k(s_00);
  gen_jmpcc(s,(byte)(insn >> 8) & 0xf,l1);
  pTVar2 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  ret = (TCGv_i32)((long)pTVar2 - (long)s_00);
  tcg_gen_ext16s_i32_m68k(s_00,ret,arg);
  tcg_gen_addi_i32_m68k(s_00,ret,ret,-1);
  gen_partset_reg(s_00,1,arg,ret);
  tcg_gen_brcondi_i32_m68k(s_00,TCG_COND_EQ,ret,-1,l1);
  local_34 = (short)uVar1;
  gen_jmp_tb(s,1,(int)local_34 + addr);
  *(byte *)l1 = *(byte *)l1 | 1;
  tcg_gen_op1_m68k(s_00,INDEX_op_set_label,(TCGArg)l1);
  gen_jmp_tb(s,0,s->pc);
  return;
}

Assistant:

DISAS_INSN(dbcc)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGLabel *l1;
    TCGv reg;
    TCGv tmp;
    int16_t offset;
    uint32_t base;

    reg = DREG(insn, 0);
    base = s->pc;
    offset = (int16_t)read_im16(env, s);
    l1 = gen_new_label(tcg_ctx);
    gen_jmpcc(s, (insn >> 8) & 0xf, l1);

    tmp = tcg_temp_new(tcg_ctx);
    tcg_gen_ext16s_i32(tcg_ctx, tmp, reg);
    tcg_gen_addi_i32(tcg_ctx, tmp, tmp, -1);
    gen_partset_reg(tcg_ctx, OS_WORD, reg, tmp);
    tcg_gen_brcondi_i32(tcg_ctx, TCG_COND_EQ, tmp, -1, l1);
    gen_jmp_tb(s, 1, base + offset);
    gen_set_label(tcg_ctx, l1);
    gen_jmp_tb(s, 0, s->pc);
}